

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O0

int CountQCost(void)

{
  int iVar1;
  undefined4 local_14;
  int QCostControl;
  int QCost;
  Cube *p;
  
  local_14 = 0;
  _QCostControl = IterCubeSetStart();
  while (_QCostControl != (Cube *)0x0) {
    iVar1 = ComputeQCostBits(_QCostControl);
    local_14 = iVar1 + local_14;
    _QCostControl = IterCubeSetNext();
  }
  return local_14;
}

Assistant:

int CountQCost()
{
    Cube* p;
    int QCost = 0;
    int QCostControl = 0;
    for ( p = IterCubeSetStart( ); p; p = IterCubeSetNext() )
    {
        QCostControl += p->q;
        QCost += ComputeQCostBits( p );
    }
//    if ( QCostControl != QCost )
//        printf( "Warning! The recorded number of literals (%d) differs from the actual number (%d)\n", QCostControl, QCost );
    return QCost;
}